

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int ffi_index_meta(lua_State *L,CTState *cts,CType *ct,MMS mm)

{
  TValue *pTVar1;
  CTypeID id_00;
  int iVar2;
  GCstr *pGVar3;
  cTValue *pcVar4;
  TValue *pTVar5;
  uint local_fc;
  GCstr *local_f8;
  TValue *o_1;
  cTValue *o;
  char *key;
  char *s;
  TValue *base;
  cTValue *tv;
  CTypeID id;
  MMS mm_local;
  CType *ct_local;
  CTState *cts_local;
  lua_State *L_local;
  
  id_00 = (CTypeID)(((long)ct - (long)cts->tab) / 0x18);
  base = lj_ctype_meta(cts,id_00,mm);
  pTVar1 = L->base;
  if (base == (cTValue *)0x0) {
LAB_0015b93b:
    pGVar3 = lj_ctype_repr(L,id_00,(GCstr *)0x0);
    if ((int)L->base[1].field_4.it >> 0xf == -5) {
      lj_err_callerv(L,LJ_ERR_FFI_BADMEMBER,pGVar3 + 1,(L->base[1].u64 & 0x7fffffffffff) + 0x18);
    }
    if ((int)L->base[1].field_4.it >> 0xf == -0xb) {
      local_f8 = lj_ctype_repr(L,(uint)*(ushort *)((L->base[1].u64 & 0x7fffffffffff) + 10),
                               (GCstr *)0x0);
      local_f8 = local_f8 + 1;
    }
    else {
      if ((uint)((int)L->base[1].field_4.it >> 0xf) < 0xfffffff3) {
        local_fc = 0xd;
      }
      else {
        local_fc = (int)L->base[1].field_4.it >> 0xf ^ 0xffffffff;
      }
      local_f8 = (GCstr *)lj_obj_itypename[local_fc];
    }
    lj_err_callerv(L,LJ_ERR_FFI_BADIDXW,pGVar3 + 1,local_f8);
  }
  if ((int)(base->field_4).it >> 0xf != -9) {
    if (mm == MM_index) {
      pcVar4 = lj_meta_tget(L,base,pTVar1 + 1);
      if (pcVar4 != (cTValue *)0x0) {
        if (pcVar4->u64 != 0xffffffffffffffff) {
          L->top[-1] = *pcVar4;
          return 1;
        }
        goto LAB_0015b93b;
      }
    }
    else {
      pTVar5 = lj_meta_tset(L,base,pTVar1 + 1);
      if (pTVar5 != (TValue *)0x0) {
        *pTVar5 = pTVar1[2];
        return 0;
      }
    }
    *pTVar1 = *L->top;
    base = L->top + -2;
  }
  iVar2 = lj_meta_tailcall(L,base);
  return iVar2;
}

Assistant:

static int ffi_index_meta(lua_State *L, CTState *cts, CType *ct, MMS mm)
{
  CTypeID id = ctype_typeid(cts, ct);
  cTValue *tv = lj_ctype_meta(cts, id, mm);
  TValue *base = L->base;
  if (!tv) {
    const char *s;
  err_index:
    s = strdata(lj_ctype_repr(L, id, NULL));
    if (tvisstr(L->base+1)) {
      lj_err_callerv(L, LJ_ERR_FFI_BADMEMBER, s, strVdata(L->base+1));
    } else {
      const char *key = tviscdata(L->base+1) ?
	strdata(lj_ctype_repr(L, cdataV(L->base+1)->ctypeid, NULL)) :
	lj_typename(L->base+1);
      lj_err_callerv(L, LJ_ERR_FFI_BADIDXW, s, key);
    }
  }
  if (!tvisfunc(tv)) {
    if (mm == MM_index) {
      cTValue *o = lj_meta_tget(L, tv, base+1);
      if (o) {
	if (tvisnil(o)) goto err_index;
	copyTV(L, L->top-1, o);
	return 1;
      }
    } else {
      TValue *o = lj_meta_tset(L, tv, base+1);
      if (o) {
	copyTV(L, o, base+2);
	return 0;
      }
    }
    copyTV(L, base, L->top);
    tv = L->top-1-LJ_FR2;
  }
  return lj_meta_tailcall(L, tv);
}